

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

void __thiscall
booster::locale::util::gregorian_calendar::from_time(gregorian_calendar *this,time_t point)

{
  date_time_error *this_00;
  long in_RSI;
  long in_RDI;
  tm tmp_tm;
  tm *t;
  time_t real_point;
  string *in_stack_ffffffffffffff48;
  tm *local_a0;
  allocator local_79;
  string local_78 [32];
  tm local_58;
  tm *local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + *(int *)(in_RDI + 0x8c);
  local_20 = (tm *)0x0;
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x89) & 1) == 0) {
    local_a0 = gmtime_r(&local_18,&local_58);
  }
  else {
    local_a0 = localtime_r(&local_18,&local_58);
  }
  local_20 = local_a0;
  if (local_a0 == (tm *)0x0) {
    this_00 = (date_time_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"boost::locale::gregorian_calendar: invalid time point",&local_79);
    date_time_error::date_time_error(this_00,in_stack_ffffffffffffff48);
    __cxa_throw(this_00,&date_time_error::typeinfo,date_time_error::~date_time_error);
  }
  memcpy((void *)(in_RDI + 0x18),local_a0,0x38);
  memcpy((void *)(in_RDI + 0x50),local_20,0x38);
  *(undefined1 *)(in_RDI + 0x88) = 1;
  *(long *)(in_RDI + 0x10) = local_10;
  return;
}

Assistant:

void from_time(std::time_t point)
        {
            std::time_t real_point = point + tzoff_;
            std::tm *t = 0;
            #ifdef BOOSTER_WIN_NATIVE
            // Windows uses TLS, thread safe
            t = is_local_ ? localtime(&real_point) : gmtime(&real_point);
            #else
            std::tm tmp_tm;
            t = is_local_ ? localtime_r(&real_point,&tmp_tm) : gmtime_r(&real_point,&tmp_tm);
            #endif
            if(!t) {
                throw date_time_error("boost::locale::gregorian_calendar: invalid time point");
            }
            tm_ = *t;
            tm_updated_ = *t;
            normalized_ = true;
            time_ = point;
        }